

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int TabItemComparerBySection(void *lhs,void *rhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ((char)*(uint *)((long)lhs + 4) < '\0') + 1;
  if ((*(uint *)((long)lhs + 4) & 0x40) != 0) {
    iVar1 = 0;
  }
  iVar2 = ((char)*(uint *)((long)rhs + 4) < '\0') + 1;
  if ((*(uint *)((long)rhs + 4) & 0x40) != 0) {
    iVar2 = 0;
  }
  iVar1 = iVar1 - iVar2;
  if (iVar1 == 0) {
    iVar1 = (int)*(short *)((long)lhs + 0x22) - (int)*(short *)((long)rhs + 0x22);
  }
  return iVar1;
}

Assistant:

static int IMGUI_CDECL TabItemComparerBySection(const void* lhs, const void* rhs)
{
    const ImGuiTabItem* a = (const ImGuiTabItem*)lhs;
    const ImGuiTabItem* b = (const ImGuiTabItem*)rhs;
    const int a_section = TabItemGetSectionIdx(a);
    const int b_section = TabItemGetSectionIdx(b);
    if (a_section != b_section)
        return a_section - b_section;
    return (int)(a->IndexDuringLayout - b->IndexDuringLayout);
}